

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

void __thiscall IDisk::DumpTrack(IDisk *this,int side,uint track,int rev)

{
  ILog *pIVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  uVar4 = 0;
  uVar2 = uVar4;
  if (this->side_[side].tracks[track].size != 0) {
    uVar2 = 0;
    do {
      uVar5 = (ulong)uVar4;
      lVar6 = 0;
      do {
        lVar3 = 0;
        do {
          uVar2 = (uVar2 + 1) - (uint)(lVar3 + uVar5 < (ulong)this->side_[side].tracks[track].size);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 8))();
        }
        uVar5 = uVar5 + 8;
        bVar7 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar7);
      uVar4 = uVar4 + 0x10;
    } while (uVar4 < this->side_[side].tracks[track].size);
  }
  if (this->log_ != (ILog *)0x0) {
    (**(code **)(*(long *)this->log_ + 0x20))();
  }
  pIVar1 = this->log_;
  if (pIVar1 != (ILog *)0x0) {
    (**(code **)(*(long *)pIVar1 + 8))(pIVar1,uVar2 & 0xff);
    return;
  }
  return;
}

Assistant:

void IDisk::DumpTrack(int side, unsigned int track, int rev)
{
   unsigned int index = 0;
   int shift = 0;
   while (index < side_[side].tracks[track].size)
   {
      for (int i = 0; i < 2; i++)
      {
         unsigned char byte = 0;
         for (int j = 0; j < 8; j++)
         {
            byte <<= 1;
            unsigned char b = (index + i * 8 + j < side_[side].tracks[track].size)
                                 ? side_[side].tracks[track].bitfield[index + i * 8 + (j * 2)]
                                 : 0;
            byte |= b & 0x1;

            if (index + i * 8 + j >= side_[side].tracks[track]./*Revolution[rev].*/size)
               shift++;
         }
         LOGB(byte)
      }
      index += 16;
   }
   LOGEOL
   LOGB(shift)
}